

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateEpsPrimInf_Test::~OsqpTest_GetAndUpdateEpsPrimInf_Test
          (OsqpTest_GetAndUpdateEpsPrimInf_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateEpsPrimInf) {
  OsqpSettings settings;
  settings.eps_prim_inf = 3.0e-3;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto eps_prim_inf = solver.GetEpsPrimInf();
    ASSERT_TRUE(eps_prim_inf.ok());
    EXPECT_EQ(*eps_prim_inf, 3.0e-3);
  }

  ASSERT_TRUE(solver.UpdateEpsPrimInf(4.0e-4).ok());
  {
    const auto eps_prim_inf = solver.GetEpsPrimInf();
    ASSERT_TRUE(eps_prim_inf.ok());
    EXPECT_EQ(*eps_prim_inf, 4.0e-4);
  }
}